

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Palette.cpp
# Opt level: O0

void __thiscall sfc::Palette::save(Palette *this,string *path)

{
  bool bVar1;
  iterator __first;
  iterator __last;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_f0;
  const_iterator local_e8;
  rgba_vec_t local_e0;
  undefined1 local_c8 [8];
  byte_vec_t nc;
  undefined1 local_a0 [8];
  Subpalette spp;
  Subpalette *sp;
  const_iterator __end1;
  const_iterator __begin1;
  vector<sfc::Subpalette,_std::allocator<sfc::Subpalette>_> *__range1;
  byte_vec_t data;
  string *path_local;
  Palette *this_local;
  
  data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)path;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&__range1);
  __end1 = std::vector<sfc::Subpalette,_std::allocator<sfc::Subpalette>_>::begin
                     (&this->_subpalettes);
  sp = (Subpalette *)
       std::vector<sfc::Subpalette,_std::allocator<sfc::Subpalette>_>::end(&this->_subpalettes);
  while( true ) {
    bVar1 = __gnu_cxx::
            operator==<const_sfc::Subpalette_*,_std::vector<sfc::Subpalette,_std::allocator<sfc::Subpalette>_>_>
                      (&__end1,(__normal_iterator<const_sfc::Subpalette_*,_std::vector<sfc::Subpalette,_std::allocator<sfc::Subpalette>_>_>
                                *)&sp);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    spp._colors_set._M_t._M_impl.super__Rb_tree_header._M_node_count =
         (size_t)__gnu_cxx::
                 __normal_iterator<const_sfc::Subpalette_*,_std::vector<sfc::Subpalette,_std::allocator<sfc::Subpalette>_>_>
                 ::operator*(&__end1);
    Subpalette::padded((Subpalette *)local_a0,
                       (Subpalette *)
                       spp._colors_set._M_t._M_impl.super__Rb_tree_header._M_node_count);
    Subpalette::colors(&local_e0,(Subpalette *)local_a0);
    pack_native_colors((byte_vec_t *)local_c8,&local_e0,this->_mode);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_e0);
    local_f0._M_current =
         (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end
                            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&__range1);
    __gnu_cxx::
    __normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>
    ::__normal_iterator<unsigned_char*>
              ((__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                *)&local_e8,&local_f0);
    __first = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin
                        ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_c8);
    __last = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end
                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_c8);
    std::vector<unsigned_char,std::allocator<unsigned_char>>::
    insert<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,void>
              ((vector<unsigned_char,std::allocator<unsigned_char>> *)&__range1,local_e8,
               (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                )__first._M_current,
               (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                )__last._M_current);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_c8);
    Subpalette::~Subpalette((Subpalette *)local_a0);
    __gnu_cxx::
    __normal_iterator<const_sfc::Subpalette_*,_std::vector<sfc::Subpalette,_std::allocator<sfc::Subpalette>_>_>
    ::operator++(&__end1);
  }
  write_file<unsigned_char>
            ((string *)
             data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage,
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&__range1);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&__range1);
  return;
}

Assistant:

void Palette::save(const std::string& path) const {
  byte_vec_t data;
  for (const auto& sp : _subpalettes) {
    Subpalette spp = sp.padded();
    auto nc = pack_native_colors(spp.colors(), _mode);
    data.insert(data.end(), nc.begin(), nc.end());
  }
  write_file(path, data);
}